

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledNewScObjArray_Impl<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>>,true>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout,
          AuxArray<unsigned_int> *spreadIndices)

{
  ProfileId profileId;
  Type ppvVar1;
  ScriptContext *scriptContext;
  ScriptFunction *caller;
  FunctionBody *pFVar2;
  InterpreterStackFrame *pIVar3;
  code *pcVar4;
  long lVar5;
  RegSlotSType RVar6;
  bool bVar7;
  ushort uVar8;
  uint uVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  Var pvVar12;
  undefined4 *puVar13;
  undefined8 *puVar14;
  uint uVar15;
  Type __s;
  Type TVar16;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  Var stackArgs [8];
  Arguments local_78;
  Arguments local_68;
  Arguments local_58;
  undefined1 auStack_48 [8];
  Arguments outArgs;
  
  __s = (Type)&uStack_c8;
  TVar16 = (Type)((ulong)(playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
                         ArgCount | 0x1000000);
  ppvVar1 = *(Type *)(this + 0x28);
  if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
    outArgs.Values._4_4_ =
         (playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).Return;
    pvVar12 = *(Var *)(this + (ulong)(playout->
                                     super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                                     ).Function * 8 + 0x160);
    uStack_d0 = 0xa8cf40;
    ValidateRegValue(this,pvVar12,false,true);
    uStack_d0 = 0xa8cf64;
    local_58.Info = TVar16;
    local_58.Values = ppvVar1;
    pvVar12 = ProfilingHelpers::ProfiledNewScObjArray
                        (pvVar12,&local_58,*(ScriptFunction **)(this + 0x80),
                         playout[1].super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
                         ArgCount,(ProfileId)
                                  playout[1].
                                  super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
                                  Return);
    uVar15 = outArgs.Values._4_4_;
  }
  else {
    uStack_d0 = 0xa8ceae;
    stackArgs[7] = (Var)TVar16;
    uVar9 = JavascriptFunction::GetSpreadSize
                      ((Arguments *)(stackArgs + 7),spreadIndices,*(ScriptContext **)(this + 0x78));
    outArgs.Info = (Type)0x0;
    uVar15 = (uVar9 & 0xffffff) + 0x1000000;
    auStack_48._4_4_ = 0;
    auStack_48._0_4_ = uVar15;
    if ((uVar9 & 0xffffff) < 9) {
      outArgs.Info = (Type)&uStack_c8;
      uStack_c8 = 0;
      stackArgs[0] = (Var)0x0;
      stackArgs[1] = (Var)0x0;
      stackArgs[2] = (Var)0x0;
      stackArgs[3] = (Var)0x0;
      stackArgs[4] = (Var)0x0;
      stackArgs[5] = (Var)0x0;
      stackArgs[6] = (Var)0x0;
      __s = (Type)&uStack_c8;
    }
    else {
      uStack_d0 = 0xa8ceee;
      ThreadContext::ProbeStack
                ((*(ScriptContext **)(this + 0x78))->threadContext,
                 (ulong)(uVar15 & 0xffffff) * 8 + 0xc00,*(ScriptContext **)(this + 0x78),(PVOID)0x0)
      ;
      uVar15 = (auStack_48._0_4_ & 0xffffff) * 8;
      lVar5 = -(ulong)(uVar15 + 0xf & 0xfffffff0);
      __s = (Type)((long)stackArgs + lVar5 + -8);
      outArgs.Info = __s;
      *(undefined8 *)((long)&uStack_d0 + lVar5) = 0xa8cf16;
      memset((void *)__s,0,(ulong)uVar15);
    }
    scriptContext = *(ScriptContext **)(this + 0x78);
    local_78.Info = TVar16;
    local_78.Values = ppvVar1;
    *(undefined8 *)((long)__s + -8) = 0xa8cfaa;
    JavascriptFunction::SpreadArgs(&local_78,(Arguments *)auStack_48,spreadIndices,scriptContext);
    uVar15 = (playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).Return;
    pvVar12 = *(Var *)(this + (ulong)(playout->
                                     super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                                     ).Function * 8 + 0x160);
    *(undefined8 *)((long)__s + -8) = 0xa8cfcc;
    ValidateRegValue(this,pvVar12,false,true);
    local_68.Info = (Type)auStack_48;
    local_68.Values = (Type)outArgs.Info;
    caller = *(ScriptFunction **)(this + 0x80);
    profileId = playout[1].super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.ArgCount;
    RVar6 = playout[1].super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Return;
    *(undefined8 *)((long)__s + -8) = 0xa8cff1;
    pvVar12 = ProfilingHelpers::ProfiledNewScObjArray
                        (pvVar12,&local_68,caller,profileId,(ProfileId)RVar6);
  }
  *(undefined8 *)((long)__s + -8) = 0xa8cfff;
  SetReg<unsigned_int>(this,uVar15,pvVar12);
  uVar8 = (playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).ArgCount + 1;
  if (uVar8 == 0) {
    *(undefined8 *)((long)__s + -8) = 0xa8d0d9;
    ::Math::DefaultOverflowPolicy();
  }
  puVar14 = (undefined8 *)(*(long *)(this + 0x30) + (ulong)uVar8 * -8);
  pFVar2 = *(FunctionBody **)(this + 0x88);
  *(undefined8 **)(this + 0x30) = puVar14;
  *(undefined8 *)(this + 0x28) = *puVar14;
  *(undefined8 *)((long)__s + -8) = 0xa8d030;
  RVar10 = FunctionBody::GetLocalsCount(pFVar2);
  pIVar3 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar10 * 8 + 0x160 <= pIVar3) {
    pFVar2 = *(FunctionBody **)(this + 0x88);
    *(undefined8 *)((long)__s + -8) = 0xa8d058;
    RVar10 = FunctionBody::GetLocalsCount(pFVar2);
    pFVar2 = *(FunctionBody **)(this + 0x88);
    *(undefined8 *)((long)__s + -8) = 0xa8d06a;
    RVar11 = FunctionBody::GetOutParamMaxDepth(pFVar2);
    if (pIVar3 < this + (ulong)RVar11 * 8 + (ulong)RVar10 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  *(undefined8 *)((long)__s + -8) = 0xa8d083;
  Throw::LogAssert();
  *(undefined8 *)((long)__s + -8) = 0xa8d093;
  puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar13 = 1;
  *(undefined8 *)((long)__s + -8) = 0xa8d0bb;
  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (bVar7) {
    *puVar13 = 0;
    return;
  }
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

void InterpreterStackFrame::OP_ProfiledNewScObjArray_Impl(const unaligned T* playout, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always profile this operation when auto-profiling so that array type changes are tracked
#if ENABLE_PROFILE_INFO
        if (!Profiled && !isAutoProfiling)
#else
        Assert(!Profiled);
#endif
        {
            OP_NewScObjArray_Impl<T, Profiled>(playout, spreadIndices);
            return;
        }

#if ENABLE_PROFILE_INFO
        Arguments args(CallInfo(CallFlags_New, playout->ArgCount), m_outParams);

        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);

            // Allocate room on the stack for the spread args.
            Arguments outArgs(CallInfo(CallFlags_New, 0), nullptr);
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);

            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    outArgs,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        else
        {
            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    args,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        PopOut(playout->ArgCount);
#endif
    }